

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.cpp
# Opt level: O0

shared_ptr<PolledShaderSource> __thiscall
Resources::getShaderSource(Resources *this,string *filename)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  PolledShaderSource *this_00;
  mapped_type *this_01;
  int *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<PolledShaderSource> sVar4;
  undefined1 local_60 [32];
  _Self local_40;
  iterator it;
  AutoInc local_28;
  AutoInc include_inc;
  string *filename_local;
  Resources *this_local;
  shared_ptr<PolledShaderSource> *source;
  
  include_inc.i = in_RDX;
  getShaderSource::AutoInc::AutoInc(&local_28,(int *)(filename + 2));
  if (*(int *)(filename + 2) < 0xb) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                 *)&filename[2]._M_string_length,(key_type *)include_inc.i);
    local_60._24_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                *)&filename[2]._M_string_length);
    bVar1 = std::operator!=(&local_40,(_Self *)(local_60 + 0x18));
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>
               ::operator->(&local_40);
      std::shared_ptr<PolledShaderSource>::shared_ptr
                ((shared_ptr<PolledShaderSource> *)this,&ppVar3->second);
    }
    else {
      local_60[0x17] = '\0';
      this_00 = (PolledShaderSource *)operator_new(0xd0);
      getFile((Resources *)local_60,filename);
      PolledShaderSource::PolledShaderSource
                (this_00,(Resources *)filename,(shared_ptr<PolledFile> *)local_60);
      std::shared_ptr<PolledShaderSource>::shared_ptr<PolledShaderSource,void>
                ((shared_ptr<PolledShaderSource> *)this,this_00);
      std::shared_ptr<PolledFile>::~shared_ptr((shared_ptr<PolledFile> *)local_60);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                              *)&filename[2]._M_string_length,(key_type *)include_inc.i);
      std::shared_ptr<PolledShaderSource>::operator=(this_01,(shared_ptr<PolledShaderSource> *)this)
      ;
      local_60[0x17] = '\x01';
    }
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    aAppDebugPrintf("Include is too deep at file %s",uVar2);
    std::shared_ptr<PolledShaderSource>::shared_ptr((shared_ptr<PolledShaderSource> *)this);
  }
  it._M_node._0_4_ = 1;
  getShaderSource::AutoInc::~AutoInc(&local_28);
  sVar4.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<PolledShaderSource>)
         sVar4.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PolledShaderSource> Resources::getShaderSource(const std::string &filename) {
	struct AutoInc {
		int &i;
		AutoInc(int &i) : i(i) { ++i; }
		~AutoInc() { --i; }
	};

	const AutoInc include_inc(shader_include_guard_);
	if (shader_include_guard_ > 10) {
		MSG("Include is too deep at file %s", filename.c_str());
		return std::shared_ptr<PolledShaderSource>();
	}

	const auto it = shader_sources_.find(filename);
	if (it != shader_sources_.end())
		return it->second;

	const std::shared_ptr<PolledShaderSource> source(
		new PolledShaderSource(*this, getFile(filename)));
	shader_sources_[filename] = source;
	return source;
}